

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers_iforest.hpp
# Opt level: O3

void __thiscall
RecursionState::RecursionState<WorkerMemory<ImputedData<int,double>,double,float>>
          (RecursionState *this,WorkerMemory<ImputedData<int,_double>,_double,_float> *workspace,
          bool full_state)

{
  pointer puVar1;
  pointer puVar2;
  size_t sVar3;
  size_t sVar4;
  double *pdVar5;
  pointer pdVar6;
  double *pdVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  pair<tsl::detail_robin_hash::robin_hash<std::pair<unsigned_long,_double>,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::robin_iterator<false>,_bool>
  pVar11;
  allocator_type local_49;
  _Head_base<0UL,_const_unsigned_long_&,_false> local_48;
  pointer puStack_40;
  pointer local_38;
  
  (this->cols_possible).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->cols_possible).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  (this->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cols_possible).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->cols_possible).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  (this->cols_possible).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  (this->col_sampler_weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->col_sampler_weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->col_sampler_weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->weights_arr)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl = (double *)0x0;
  this->full_state = full_state;
  this->split_ix = workspace->split_ix;
  this->end = workspace->end;
  if ((workspace->col_sampler).tree_weights.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (workspace->col_sampler).tree_weights.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    this->sampler_pos = (workspace->col_sampler).curr_pos;
    if (!full_state) {
      return;
    }
  }
  else {
    std::vector<double,_std::allocator<double>_>::operator=
              (&this->col_sampler_weights,&(workspace->col_sampler).tree_weights);
    this->n_dropped = (workspace->col_sampler).n_dropped;
    if ((this->full_state & 1U) == 0) {
      return;
    }
  }
  this->st = workspace->st;
  uVar9 = workspace->st_NA;
  this->st_NA = uVar9;
  uVar8 = workspace->end_NA;
  this->end_NA = uVar8;
  this->changed_weights = workspace->changed_weights;
  if (uVar9 < uVar8 &&
      (workspace->comb_val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (workspace->comb_val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    puVar1 = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    std::vector<unsigned_long,std::allocator<unsigned_long>>::
    vector<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,void>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_48,
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )(puVar1 + uVar9),
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )(puVar1 + uVar8),&local_49);
    puVar1 = (this->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar2 = (this->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = local_48._M_head_impl;
    (this->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puStack_40;
    (this->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_38;
    local_48._M_head_impl = (unsigned_long *)0x0;
    puStack_40 = (pointer)0x0;
    local_38 = (pointer)0x0;
    if ((puVar1 != (pointer)0x0) &&
       (operator_delete(puVar1,(long)puVar2 - (long)puVar1),
       local_48._M_head_impl != (unsigned_long *)0x0)) {
      operator_delete(local_48._M_head_impl,(long)local_38 - (long)local_48._M_head_impl);
    }
    if (this->changed_weights == true) {
      sVar3 = workspace->st_NA;
      sVar4 = workspace->end_NA;
      uVar9 = sVar4 - sVar3;
      pdVar7 = (double *)operator_new__(-(ulong)(uVar9 >> 0x3d != 0) | uVar9 * 8);
      pdVar5 = (this->weights_arr)._M_t.
               super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
               super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
               super__Head_base<0UL,_double_*,_false>._M_head_impl;
      (this->weights_arr)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
      super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
      super__Head_base<0UL,_double_*,_false>._M_head_impl = pdVar7;
      if (pdVar5 != (double *)0x0) {
        operator_delete__(pdVar5);
      }
      pdVar6 = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (pdVar6 == (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_finish) {
        if (sVar4 != sVar3) {
          lVar10 = 0;
          do {
            local_48._M_head_impl =
                 (unsigned_long *)
                 ((long)(workspace->ix_arr).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar10 + workspace->st_NA * 8);
            pVar11 = tsl::detail_robin_hash::
                     robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                     ::
                     insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                               ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                                 *)&workspace->weights_map,local_48._M_head_impl,
                                (piecewise_construct_t *)&std::piecewise_construct,
                                (tuple<const_unsigned_long_&> *)&local_48,(tuple<> *)&local_49);
            *(undefined8 *)
             ((long)(this->weights_arr)._M_t.
                    super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                    super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                    super__Head_base<0UL,_double_*,_false>._M_head_impl + lVar10) =
                 *(undefined8 *)((pVar11.first.m_bucket.m_bucket)->m_value + 8);
            lVar10 = lVar10 + 8;
            uVar9 = uVar9 - 1;
          } while (uVar9 != 0);
        }
      }
      else if (sVar4 != sVar3) {
        sVar3 = workspace->st_NA;
        puVar1 = (workspace->ix_arr).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar5 = (this->weights_arr)._M_t.
                 super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                 super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                 super__Head_base<0UL,_double_*,_false>._M_head_impl;
        uVar8 = 0;
        do {
          pdVar5[uVar8] = pdVar6[puVar1[sVar3 + uVar8]];
          uVar8 = uVar8 + 1;
        } while (uVar9 != uVar8);
      }
    }
  }
  return;
}

Assistant:

RecursionState::RecursionState(WorkerMemory &workspace, bool full_state)
{
    this->full_state = full_state;

    this->split_ix         =  workspace.split_ix;
    this->end              =  workspace.end;
    if (!workspace.col_sampler.has_weights())
        this->sampler_pos  =  workspace.col_sampler.curr_pos;
    else {
        this->col_sampler_weights = workspace.col_sampler.tree_weights;
        this->n_dropped           = workspace.col_sampler.n_dropped;
    }

    if (this->full_state)
    {
        this->st           = workspace.st;
        this->st_NA        = workspace.st_NA;
        this->end_NA       = workspace.end_NA;

        this->changed_weights = workspace.changed_weights;

        /* for the extended model, it's not necessary to copy everything */
        if (workspace.comb_val.empty() && workspace.st_NA < workspace.end_NA)
        {
            this->ix_arr = std::vector<size_t>(workspace.ix_arr.begin() + workspace.st_NA,
                                               workspace.ix_arr.begin() + workspace.end_NA);
            if (this->changed_weights)
            {
                size_t tot = workspace.end_NA - workspace.st_NA;
                this->weights_arr = std::unique_ptr<double[]>(new double[tot]);
                if (!workspace.weights_arr.empty())
                    for (size_t ix = 0; ix < tot; ix++)
                        this->weights_arr[ix] = workspace.weights_arr[workspace.ix_arr[ix + workspace.st_NA]];
                else
                    for (size_t ix = 0; ix < tot; ix++)
                        this->weights_arr[ix] = workspace.weights_map[workspace.ix_arr[ix + workspace.st_NA]];
            }
        }
    }
}